

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

Vec_Ptr_t * Llb_ManGroupCollect(Llb_Grp_t *pGroup)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Aig_Obj_t *pAVar2;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Llb_Grp_t *pGroup_local;
  
  vNodes_00 = Vec_PtrAlloc(100);
  Aig_ManIncrementTravId(pGroup->pMan->pAig);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pGroup->vIns), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vIns,local_24);
    Aig_ObjSetTravIdCurrent(pGroup->pMan->pAig,pAVar2);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pGroup->vOuts), local_24 < iVar1; local_24 = local_24 + 1)
  {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vOuts,local_24);
    Aig_ObjSetTravIdPrevious(pGroup->pMan->pAig,pAVar2);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pGroup->vOuts), local_24 < iVar1; local_24 = local_24 + 1)
  {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vOuts,local_24);
    Llb_ManGroupCollect_rec(pGroup->pMan->pAig,pAVar2,vNodes_00);
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Llb_ManGroupCollect( Llb_Grp_t * pGroup )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId( pGroup->pMan->pAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        Aig_ObjSetTravIdCurrent( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Aig_ObjSetTravIdPrevious( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Llb_ManGroupCollect_rec( pGroup->pMan->pAig, pObj, vNodes );
    return vNodes;
}